

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O1

bool Diligent::LinuxFileSystem::IsDirectory(Char *strPath)

{
  int iVar1;
  string path;
  stat StatBuff;
  String local_d0;
  stat local_b0;
  
  std::__cxx11::string::string((string *)&local_d0,strPath,(allocator *)&local_b0);
  BasicFileSystem::CorrectSlashes(&local_d0,'\0');
  iVar1 = stat(local_d0._M_dataplus._M_p,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0 && (local_b0.st_mode & 0xf000) == 0x4000;
}

Assistant:

bool LinuxFileSystem::IsDirectory(const Char* strPath)
{
    std::string path{strPath};
    CorrectSlashes(path);

    struct stat StatBuff;
    if (stat(path.c_str(), &StatBuff) != 0)
        return false;

    return S_ISDIR(StatBuff.st_mode);
}